

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_net.c
# Opt level: O2

int tnt_init(tnt_stream *s)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  tnt_schema *ptVar4;
  int iVar5;
  long lVar6;
  bool bVar7;
  
  pvVar1 = s->data;
  ptVar4 = tnt_schema_new((tnt_schema *)0x0);
  *(tnt_schema **)((long)pvVar1 + 0x100) = ptVar4;
  iVar3 = -1;
  iVar5 = 2;
  lVar6 = 0xf0;
  if (ptVar4 != (tnt_schema *)0x0) {
    iVar2 = tnt_iob_init((tnt_iob *)((long)pvVar1 + 0x80),(long)*(int *)((long)pvVar1 + 0x58),
                         *(tnt_iob_tx_t *)((long)pvVar1 + 0x40),
                         *(tnt_iob_txv_t *)((long)pvVar1 + 0x48),*(void **)((long)pvVar1 + 0x50));
    if (iVar2 != -1) {
      iVar3 = tnt_iob_init((tnt_iob *)((long)pvVar1 + 0xb8),(long)*(int *)((long)pvVar1 + 0x70),
                           *(tnt_iob_tx_t *)((long)pvVar1 + 0x60),(tnt_iob_txv_t)0x0,
                           *(void **)((long)pvVar1 + 0x68));
      bVar7 = iVar3 == -1;
      lVar6 = 0x108;
      if (bVar7) {
        lVar6 = 0xf0;
      }
      iVar5 = bVar7 + 1;
      iVar3 = -(uint)bVar7;
    }
  }
  *(int *)((long)pvVar1 + lVar6) = iVar5;
  return iVar3;
}

Assistant:

int tnt_init(struct tnt_stream *s) {
	struct tnt_stream_net *sn = TNT_SNET_CAST(s);
	if ((sn->schema = tnt_schema_new(NULL)) == NULL) {
		sn->error = TNT_EMEMORY;
		return -1;
	}
	if (tnt_iob_init(&sn->sbuf, sn->opt.send_buf, sn->opt.send_cb,
		sn->opt.send_cbv, sn->opt.send_cb_arg) == -1) {
		sn->error = TNT_EMEMORY;
		return -1;
	}
	if (tnt_iob_init(&sn->rbuf, sn->opt.recv_buf, sn->opt.recv_cb, NULL,
		sn->opt.recv_cb_arg) == -1) {
		sn->error = TNT_EMEMORY;
		return -1;
	}
	sn->inited = 1;
	return 0;
}